

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void google::protobuf::text_format_unittest::TextFormatExtensionsTest::SetUpTestSuite(void)

{
  undefined8 extraout_RAX;
  AlphaNum *in_R8;
  Status local_e8;
  string local_e0;
  long *local_c0;
  undefined8 local_b8;
  long local_b0 [2];
  undefined8 local_a0;
  long *local_98;
  AlphaNum local_70;
  AlphaNum local_40;
  
  TestSourceDir_abi_cxx11_();
  local_a0 = local_b8;
  local_98 = local_c0;
  local_40.piece_._M_len = 1;
  local_40.piece_._M_str = "/";
  local_70.piece_._M_len = 0x41;
  local_70.piece_._M_str = "google/protobuf/testdata/text_format_unittest_extensions_data.txt";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_e0,(lts_20250127 *)&local_a0,&local_40,&local_70,in_R8);
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  File::ReadFileToString
            ((File *)&local_e8,&local_e0,(string *)&static_proto_text_format__abi_cxx11_,false);
  if ((StatusRep *)local_e8.rep_ != (StatusRep *)0x1) {
    absl::lts_20250127::status_internal::MakeCheckFailString
              (&local_e8,
               "File::GetContents( TestUtil::GetTestDataPath(\"google/protobuf/testdata/\" \"text_format_unittest_extensions_data.txt\"), &static_proto_text_format_, true) is OK"
              );
  }
  if ((local_e8.rep_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_e8.rep_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((StatusRep *)local_e8.rep_ != (StatusRep *)0x1) {
    SetUpTestSuite();
    __clang_call_terminate(extraout_RAX);
  }
  return;
}

Assistant:

static void SetUpTestSuite() {
    ABSL_CHECK_OK(File::GetContents(
        TestUtil::GetTestDataPath("google/protobuf/testdata/"
                                  "text_format_unittest_extensions_data.txt"),
        &static_proto_text_format_, true));
  }